

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

char * lyd_path_set(ly_set *dnodes,LYD_PATH_TYPE pathtype)

{
  uint16_t uVar1;
  lyd_node *node;
  LY_ERR LVar2;
  int iVar3;
  lysc_node *plVar4;
  lys_module *plVar5;
  size_t sVar6;
  char *pcVar7;
  char *local_b8;
  size_t local_a8;
  long local_98;
  ly_ctx *local_90;
  ly_ctx *local_80;
  lysc_node *local_78;
  lysc_node *local_70;
  lyd_node *local_68;
  LY_ERR local_5c;
  LY_ERR rc;
  lys_module *prev_mod;
  lys_module *mod;
  lyd_node *parent;
  lyd_node *iter;
  char *buffer;
  size_t len;
  size_t buflen;
  size_t bufused;
  uint32_t depth;
  LYD_PATH_TYPE pathtype_local;
  ly_set *dnodes_local;
  
  buflen = 0;
  len = 0;
  iter = (lyd_node *)0x0;
  if (pathtype < 2) {
    bufused._4_4_ = pathtype;
    _depth = dnodes;
    for (bufused._0_4_ = 1; (uint)bufused <= _depth->count; bufused._0_4_ = (uint)bufused + 1) {
      node = (_depth->field_2).dnodes[(uint)bufused - 1];
      prev_mod = lyd_node_module(node);
      if ((uint)bufused < 2) {
        local_68 = (lyd_node *)0x0;
      }
      else {
        local_68 = (_depth->field_2).dnodes[(uint)bufused - 2];
      }
      if ((((local_68 != (lyd_node *)0x0) && (node->schema != (lysc_node *)0x0)) &&
          (local_68->schema != (lysc_node *)0x0)) && ((local_68->schema->nodetype & 0x60) == 0)) {
        if (node->schema == (lysc_node *)0x0) {
          local_70 = (lysc_node *)0x0;
        }
        else {
          local_70 = node->schema->parent;
        }
        plVar4 = lysc_data_node(local_70);
        if (plVar4 != local_68->schema) {
          if (node->schema == (lysc_node *)0x0) {
            local_78 = (lysc_node *)0x0;
          }
          else {
            local_78 = node->schema->parent;
          }
          plVar4 = lysc_data_node(local_78);
          if (plVar4 == (lysc_node *)0x0) {
            if (node->schema == (lysc_node *)0x0) {
              local_80 = (ly_ctx *)node[2].schema;
            }
            else {
              local_80 = node->schema->module->ctx;
            }
            if (local_68->schema == (lysc_node *)0x0) {
              local_90 = (ly_ctx *)local_68[2].schema;
            }
            else {
              local_90 = local_68->schema->module->ctx;
            }
            if (local_80 != local_90) goto LAB_00130996;
          }
          if ((local_68->schema->nodetype & 0x700) == 0) {
            __assert_fail("!parent || !iter->schema || !parent->schema || (parent->schema->nodetype & LYD_NODE_ANY) || (lysc_data_parent(iter->schema) == parent->schema) || (!lysc_data_parent(iter->schema) && (LYD_CTX(iter) != LYD_CTX(parent))) || (parent->schema->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                          ,0xb74,"char *lyd_path_set(const struct ly_set *, LYD_PATH_TYPE)");
          }
        }
      }
LAB_00130996:
      plVar5 = lyd_node_module(local_68);
      if (plVar5 == prev_mod) {
        prev_mod = (lys_module *)0x0;
      }
      if (prev_mod == (lys_module *)0x0) {
        local_98 = 0;
      }
      else {
        sVar6 = strlen(prev_mod->name);
        local_98 = sVar6 + 1;
      }
      if (node->schema == (lysc_node *)0x0) {
        local_a8 = strlen((char *)node[1].schema);
      }
      else {
        local_a8 = strlen(node->schema->name);
      }
      buffer = (char *)(local_98 + 1 + local_a8);
      LVar2 = lyd_path_str_enlarge((char **)&iter,&len,(size_t)(buffer + buflen),'\0');
      if (LVar2 != LY_SUCCESS) {
        return (char *)iter;
      }
      if (prev_mod == (lys_module *)0x0) {
        local_b8 = "";
      }
      else {
        local_b8 = prev_mod->name;
      }
      pcVar7 = "";
      if (prev_mod != (lys_module *)0x0) {
        pcVar7 = ":";
      }
      iVar3 = sprintf((char *)((long)&iter->hash + buflen),"/%s%s%s",local_b8,pcVar7);
      buflen = (long)iVar3 + buflen;
      local_5c = LY_SUCCESS;
      if ((node->schema != (lysc_node *)0x0) &&
         ((1 < (uint)bufused || (bufused._4_4_ == LYD_PATH_STD)))) {
        uVar1 = node->schema->nodetype;
        if (uVar1 == 8) {
          if ((node->schema->flags & 1) == 0) {
            local_5c = lyd_path_position_predicate(node,(char **)&iter,&len,&buflen,'\0');
          }
          else {
            local_5c = lyd_path_leaflist_predicate(node,(char **)&iter,&len,&buflen,'\0');
          }
        }
        else if (uVar1 == 0x10) {
          if ((node->schema->flags & 0x200) == 0) {
            local_5c = lyd_path_list_predicate(node,(char **)&iter,&len,&buflen,'\0');
          }
          else {
            local_5c = lyd_path_position_predicate(node,(char **)&iter,&len,&buflen,'\0');
          }
        }
      }
      if (local_5c != LY_SUCCESS) {
        return (char *)iter;
      }
    }
  }
  return (char *)iter;
}

Assistant:

char *
lyd_path_set(const struct ly_set *dnodes, LYD_PATH_TYPE pathtype)
{
    uint32_t depth;
    size_t bufused = 0, buflen = 0, len;
    char *buffer = NULL;
    const struct lyd_node *iter, *parent;
    const struct lys_module *mod, *prev_mod;
    LY_ERR rc = LY_SUCCESS;

    switch (pathtype) {
    case LYD_PATH_STD:
    case LYD_PATH_STD_NO_LAST_PRED:
        for (depth = 1; depth <= dnodes->count; ++depth) {
            /* current node */
            iter = dnodes->dnodes[depth - 1];
            mod = lyd_node_module(iter);

            /* parent */
            parent = (depth > 1) ? dnodes->dnodes[depth - 2] : NULL;
            assert(!parent || !iter->schema || !parent->schema || (parent->schema->nodetype & LYD_NODE_ANY) ||
                    (lysc_data_parent(iter->schema) == parent->schema) ||
                    (!lysc_data_parent(iter->schema) && (LYD_CTX(iter) != LYD_CTX(parent))) ||
                    (parent->schema->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF)));

            /* get module to print, if any */
            prev_mod = lyd_node_module(parent);
            if (prev_mod == mod) {
                mod = NULL;
            }

            /* realloc string */
            len = 1 + (mod ? strlen(mod->name) + 1 : 0) + (iter->schema ? strlen(iter->schema->name) :
                    strlen(((struct lyd_node_opaq *)iter)->name.name));
            if ((rc = lyd_path_str_enlarge(&buffer, &buflen, bufused + len, 0))) {
                break;
            }

            /* print next node */
            bufused += sprintf(buffer + bufused, "/%s%s%s", mod ? mod->name : "", mod ? ":" : "", LYD_NAME(iter));

            /* do not always print the last (first) predicate */
            if (iter->schema && ((depth > 1) || (pathtype == LYD_PATH_STD))) {
                switch (iter->schema->nodetype) {
                case LYS_LIST:
                    if (iter->schema->flags & LYS_KEYLESS) {
                        /* print its position */
                        rc = lyd_path_position_predicate(iter, &buffer, &buflen, &bufused, 0);
                    } else {
                        /* print all list keys in predicates */
                        rc = lyd_path_list_predicate(iter, &buffer, &buflen, &bufused, 0);
                    }
                    break;
                case LYS_LEAFLIST:
                    if (iter->schema->flags & LYS_CONFIG_W) {
                        /* print leaf-list value */
                        rc = lyd_path_leaflist_predicate(iter, &buffer, &buflen, &bufused, 0);
                    } else {
                        /* print its position */
                        rc = lyd_path_position_predicate(iter, &buffer, &buflen, &bufused, 0);
                    }
                    break;
                default:
                    /* nothing to print more */
                    break;
                }
            }
            if (rc) {
                break;
            }
        }
        break;
    }

    return buffer;
}